

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddPort.c
# Opt level: O1

DdNode * zddPortToBddStep(DdManager *dd,DdNode *f,int depth)

{
  int *piVar1;
  DdNode *n;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *data;
  uint uVar4;
  
  pDVar3 = dd->one;
  if (dd->zero == f) {
    pDVar3 = (DdNode *)((ulong)pDVar3 ^ 1);
  }
  else if (dd->sizeZ != depth) {
    uVar4 = 0x7fffffff;
    if ((ulong)f->index != 0x7fffffff) {
      uVar4 = dd->permZ[f->index];
    }
    n = cuddUniqueInter(dd,dd->invpermZ[depth],pDVar3,(DdNode *)((ulong)pDVar3 ^ 1));
    if (n != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      if ((uint)depth < uVar4) {
        pDVar2 = zddPortToBddStep(dd,f,depth + 1);
        if (pDVar2 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar3 = cuddBddIteRecur(dd,n,(DdNode *)((ulong)pDVar3 ^ 1),pDVar2);
          if (pDVar3 != (DdNode *)0x0) {
            piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDeref(dd,n);
            Cudd_RecursiveDeref(dd,pDVar2);
            piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            return pDVar3;
          }
          Cudd_RecursiveDeref(dd,n);
          n = pDVar2;
        }
      }
      else {
        pDVar3 = cuddCacheLookup1(dd,Cudd_zddPortToBdd,f);
        if (pDVar3 != (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,n);
          return pDVar3;
        }
        pDVar3 = zddPortToBddStep(dd,(f->type).kids.T,depth + 1);
        if (pDVar3 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar2 = zddPortToBddStep(dd,(f->type).kids.E,depth + 1);
          if (pDVar2 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,n);
            n = pDVar3;
          }
          else {
            piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            data = cuddBddIteRecur(dd,n,pDVar3,pDVar2);
            if (data != (DdNode *)0x0) {
              piVar1 = (int *)(((ulong)data & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              Cudd_RecursiveDeref(dd,n);
              Cudd_RecursiveDeref(dd,pDVar3);
              Cudd_RecursiveDeref(dd,pDVar2);
              piVar1 = (int *)(((ulong)data & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + -1;
              cuddCacheInsert1(dd,Cudd_zddPortToBdd,f,data);
              return data;
            }
            Cudd_RecursiveDeref(dd,n);
            Cudd_RecursiveDeref(dd,pDVar3);
            n = pDVar2;
          }
        }
      }
      Cudd_RecursiveDeref(dd,n);
    }
    pDVar3 = (DdNode *)0x0;
  }
  return pDVar3;
}

Assistant:

static DdNode *
zddPortToBddStep(
  DdManager * dd /* manager */,
  DdNode * f /* ZDD to be converted */,
  int  depth /* recursion depth */)
{
    DdNode *one, *zero, *T, *E, *res, *var;
    unsigned int index;
    unsigned int level;

    statLine(dd);
    one = DD_ONE(dd);
    zero = DD_ZERO(dd);
    if (f == zero) return(Cudd_Not(one));

    if (depth == dd->sizeZ) return(one);

    index = dd->invpermZ[depth];
    level = cuddIZ(dd,f->index);
    var = cuddUniqueInter(dd,index,one,Cudd_Not(one));
    if (var == NULL) return(NULL);
    cuddRef(var);

    if (level > (unsigned) depth) {
        E = zddPortToBddStep(dd,f,depth+1);
        if (E == NULL) {
            Cudd_RecursiveDeref(dd,var);
            return(NULL);
        }
        cuddRef(E);
        res = cuddBddIteRecur(dd,var,Cudd_Not(one),E);
        if (res == NULL) {
            Cudd_RecursiveDeref(dd,var);
            Cudd_RecursiveDeref(dd,E);
            return(NULL);
        }
        cuddRef(res);
        Cudd_RecursiveDeref(dd,var);
        Cudd_RecursiveDeref(dd,E);
        cuddDeref(res);
        return(res);
    }

    res = cuddCacheLookup1(dd,Cudd_zddPortToBdd,f);
    if (res != NULL) {
        Cudd_RecursiveDeref(dd,var);
        return(res);
    }

    T = zddPortToBddStep(dd,cuddT(f),depth+1);
    if (T == NULL) {
        Cudd_RecursiveDeref(dd,var);
        return(NULL);
    }
    cuddRef(T);
    E = zddPortToBddStep(dd,cuddE(f),depth+1);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd,var);
        Cudd_RecursiveDeref(dd,T);
        return(NULL);
    }
    cuddRef(E);

    res = cuddBddIteRecur(dd,var,T,E);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd,var);
        Cudd_RecursiveDeref(dd,T);
        Cudd_RecursiveDeref(dd,E);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd,var);
    Cudd_RecursiveDeref(dd,T);
    Cudd_RecursiveDeref(dd,E);
    cuddDeref(res);

    cuddCacheInsert1(dd,Cudd_zddPortToBdd,f,res);

    return(res);

}